

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNameTreeObjectHelper.cc
# Opt level: O0

void __thiscall QPDFNameTreeObjectHelper::iterator::updateIValue(iterator *this)

{
  bool bVar1;
  element_type *peVar2;
  pointer pTVar3;
  QPDFObjectHandle local_b0 [2];
  string local_90;
  undefined1 local_70 [8];
  element_type p;
  iterator *this_local;
  
  p.ivalue.second.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  peVar2 = std::__shared_ptr_access<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&this->impl);
  bVar1 = NNTreeIterator::valid(peVar2);
  if (bVar1) {
    peVar2 = std::__shared_ptr_access<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->impl);
    NNTreeIterator::NNTreeIterator((NNTreeIterator *)local_70,peVar2);
    pTVar3 = NNTreeIterator::operator->((NNTreeIterator *)local_70);
    QPDFObjectHandle::getUTF8Value_abi_cxx11_(&local_90,&pTVar3->first);
    std::__cxx11::string::operator=((string *)&this->ivalue,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    pTVar3 = NNTreeIterator::operator->((NNTreeIterator *)local_70);
    QPDFObjectHandle::operator=(&(this->ivalue).second,&pTVar3->second);
    NNTreeIterator::~NNTreeIterator((NNTreeIterator *)local_70);
  }
  else {
    std::__cxx11::string::operator=((string *)&this->ivalue,"");
    memset(local_b0,0,0x10);
    QPDFObjectHandle::QPDFObjectHandle(local_b0);
    QPDFObjectHandle::operator=(&(this->ivalue).second,local_b0);
    QPDFObjectHandle::~QPDFObjectHandle(local_b0);
  }
  return;
}

Assistant:

void
QPDFNameTreeObjectHelper::iterator::updateIValue()
{
    if (impl->valid()) {
        auto p = *impl;
        this->ivalue.first = p->first.getUTF8Value();
        this->ivalue.second = p->second;
    } else {
        this->ivalue.first = "";
        this->ivalue.second = QPDFObjectHandle();
    }
}